

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<float,char_const(&)[6],double,char_const(&)[6],int>
          (String *__return_storage_ptr__,kj *this,float *params,char (*params_1) [6],
          double *params_2,char (*params_3) [6],int *params_4)

{
  undefined1 local_b0 [16];
  undefined1 local_a0 [48];
  CappedArray<char,_14UL> local_70;
  CappedArray<char,_32UL> local_58;
  
  _::Stringifier::operator*
            ((CappedArray<char,_24UL> *)(local_a0 + 0x10),(Stringifier *)&_::STR,*(float *)this);
  local_a0._8_8_ = strlen((char *)params);
  local_a0._0_8_ = params;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(double *)params_1);
  local_b0._8_8_ = strlen((char *)params_2);
  local_b0._0_8_ = params_2;
  _::Stringifier::operator*
            (&local_70,(Stringifier *)&_::STR,
             (int)((CappedArray<char,_14UL> *)params_3)->currentSize);
  _::
  concat<kj::CappedArray<char,24ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,32ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)(local_a0 + 0x10),(CappedArray<char,_24UL> *)local_a0,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_32UL> *)local_b0,
             (ArrayPtr<const_char> *)&local_70,(CappedArray<char,_14UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}